

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int32 intConst,Instr *instr,Opnd *opnd)

{
  Sym *sym;
  bool bVar1;
  Value **ppVVar2;
  Value *val;
  Value *pVVar3;
  Value *local_40;
  int32 symStoreIntConstantValue;
  int32 local_34 [2];
  int32 intConst_local;
  
  local_40 = (Value *)0x0;
  local_34[0] = intConst;
  ppVVar2 = JsUtil::
            BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::LookupWithKey<int>(this->intConstantToValueMap,local_34,&local_40);
  pVVar3 = *ppVVar2;
  if ((pVVar3 != (Value *)0x0) && (sym = pVVar3->valueInfo->symStore, sym != (Sym *)0x0)) {
    bVar1 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,sym);
    if (bVar1) {
      val = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,sym);
      if ((val != (Value *)0x0) && (val->valueNumber == pVVar3->valueNumber)) {
        bVar1 = ValueInfo::TryGetIntConstantValue(val->valueInfo,(int32 *)&local_40,false);
        if ((bVar1) && ((int)local_40 == local_34[0])) goto LAB_0042aeaa;
      }
    }
  }
  val = NewIntConstantValue(this,local_34[0],instr,true);
LAB_0042aeaa:
  pVVar3 = GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,val,opnd);
  return pVVar3;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int32 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Value *value = nullptr;
    Value *const cachedValue = this->intConstantToValueMap->Lookup(intConst, nullptr);

    if(cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && CurrentBlockData()->IsLive(symStore))
        {

            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            int32 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetIntConstantValue(&symStoreIntConstantValue) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewIntConstantValue(intConst, instr, !Js::TaggedInt::IsOverflow(intConst));
    }

    return CurrentBlockData()->InsertNewValue(value, opnd);
}